

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_register_simple_type_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp parent,sexp slots)

{
  bool bVar1;
  ushort uVar2;
  sexp psVar3;
  sexp psVar4;
  sexp psVar5;
  sexp_sint_t n_00;
  sexp_sint_t extraout_RDX;
  sexp_sint_t n_01;
  sexp_sint_t extraout_RDX_00;
  short sVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  psVar5 = ctx;
  psVar3 = sexp_length_op(ctx,self,n,slots);
  sVar6 = (short)((ulong)psVar3 >> 1);
  if ((((ulong)parent & 3) == 0 && parent != (sexp)0x0) && (parent->tag == 1)) {
    psVar4 = sexp_length_op(psVar5,self,n_00,(parent->value).type.slots);
    iVar7 = (int)((ulong)psVar3 >> 1) + ((uint)((ulong)psVar4 >> 1) & 0x7fffffff);
    sVar6 = (short)iVar7;
    psVar3 = (parent->value).type.cpl;
    if ((((ulong)psVar3 & 3) == 0) &&
       ((psVar3->tag == 10 && (uVar2 = *(short *)&psVar3->value - 1, -1 < (short)uVar2)))) {
      n_01 = extraout_RDX;
      lVar8 = (ulong)uVar2 + 1;
      do {
        psVar4 = sexp_length_op(psVar5,self,n_01,
                                *(sexp *)(*(long *)((long)&psVar3->value + lVar8 * 8) + 0x18));
        iVar7 = iVar7 + ((uint)((ulong)psVar4 >> 1) & 0x7fffffff);
        sVar6 = (short)iVar7;
        lVar9 = lVar8 + -1;
        bVar1 = 0 < lVar8;
        n_01 = extraout_RDX_00;
        lVar8 = lVar9;
      } while (lVar9 != 0 && bVar1);
    }
  }
  psVar5 = (sexp)((long)sVar6 * 2 | 1);
  psVar5 = sexp_register_type_op
                     (ctx,(sexp)0x0,1,name,parent,slots,(sexp)&DAT_00000011,psVar5,psVar5,
                      (sexp)&DAT_00000001,(sexp)&DAT_00000001,(sexp)((long)sVar6 * 0x10 + 0x11),
                      (sexp)&DAT_00000001,(sexp)&DAT_00000001,(sexp)&DAT_00000001,
                      (sexp)&DAT_00000001,(sexp)&DAT_00000001,(sexp)&DAT_00000001,
                      (sexp)&DAT_00000001,
                      (sexp)((((ctx->value).type.setters)->value).port.stream)->_freeres_list->
                            _IO_buf_base,(char *)0x0,(sexp_proc2)0x0);
  return psVar5;
}

Assistant:

sexp sexp_register_simple_type_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp parent, sexp slots) {
  short i, num_slots = (short)sexp_unbox_fixnum(sexp_length(ctx, slots));
  sexp type_size, num_slots_obj, cpl, tmp;
  if (parent && sexp_typep(parent)) {
    num_slots += (short)sexp_unbox_fixnum(sexp_length(ctx, sexp_type_slots(parent)));
    if (sexp_vectorp((cpl = sexp_type_cpl(parent))))
      for (i=(short)sexp_vector_length(cpl)-1; i>=0; i--) {
        tmp = sexp_vector_ref(cpl, sexp_make_fixnum(i));
        num_slots += (short)sexp_unbox_fixnum(sexp_length(ctx, sexp_type_slots(tmp)));
      }
  }
  num_slots_obj = sexp_make_fixnum(num_slots);
  type_size = sexp_make_fixnum(sexp_sizeof_header + sizeof(sexp)*num_slots);
  return
    sexp_register_type(ctx, name, parent, slots,
                       sexp_make_fixnum(sexp_offsetof_slot0),
                       num_slots_obj, num_slots_obj, SEXP_ZERO, SEXP_ZERO,
                       type_size, SEXP_ZERO, SEXP_ZERO, SEXP_ZERO, SEXP_ZERO,
                       SEXP_ZERO, SEXP_ZERO, SEXP_ZERO,
                       sexp_type_print(sexp_type_by_index(ctx, SEXP_EXCEPTION)),
                       NULL, NULL);
}